

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::bothOrAll_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,size_t count)

{
  char *__s;
  allocator<char> local_9;
  
  if (this == (_anonymous_namespace_ *)0x1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __s = "all ";
    if (this == (_anonymous_namespace_ *)0x2) {
      __s = "both ";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bothOrAll( std::size_t count ) {
        return count == 1 ? std::string() :
               count == 2 ? "both " : "all " ;
    }